

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.c
# Opt level: O1

int netaddr_from_string(netaddr *dst,char *src)

{
  undefined2 uVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  char *src_00;
  ushort **ppuVar7;
  char cVar8;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar9;
  ushort *puVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  size_t bin_size;
  int iVar15;
  char *pcVar16;
  long lVar17;
  bool bVar18;
  char *ptr3;
  netaddr_str buf;
  uint local_90;
  char *local_78;
  char local_6e [62];
  
  dst->_addr[0] = '\0';
  dst->_addr[1] = '\0';
  dst->_addr[2] = '\0';
  dst->_addr[3] = '\0';
  dst->_addr[4] = '\0';
  dst->_addr[5] = '\0';
  dst->_addr[6] = '\0';
  dst->_addr[7] = '\0';
  dst->_addr[8] = '\0';
  dst->_addr[9] = '\0';
  dst->_addr[10] = '\0';
  dst->_addr[0xb] = '\0';
  dst->_addr[0xc] = '\0';
  dst->_addr[0xd] = '\0';
  dst->_addr[0xe] = '\0';
  dst->_addr[0xf] = '\0';
  dst->_type = '\0';
  dst->_prefix_len = '\0';
  iVar6 = strcmp(src,"-");
  if (iVar6 == 0) {
    dst->_addr[0] = '\0';
    dst->_addr[1] = '\0';
    dst->_addr[2] = '\0';
    dst->_addr[3] = '\0';
    dst->_addr[4] = '\0';
    dst->_addr[5] = '\0';
    dst->_addr[6] = '\0';
    dst->_addr[7] = '\0';
    dst->_addr[8] = '\0';
    dst->_addr[9] = '\0';
    dst->_addr[10] = '\0';
    dst->_addr[0xb] = '\0';
    dst->_addr[0xc] = '\0';
    dst->_addr[0xd] = '\0';
    dst->_addr[0xe] = '\0';
    dst->_addr[0xf] = '\0';
    dst->_type = '\0';
    dst->_prefix_len = '\0';
    return 0;
  }
  lVar17 = 8;
  do {
    iVar6 = strcasecmp(src,*(char **)((long)&__do_global_dtors_aux_fini_array_entry + lVar17));
    if (iVar6 == 0) {
      puVar2 = *(undefined8 **)((long)&_known_prefixes[0].name + lVar17);
      uVar1 = *(undefined2 *)(puVar2 + 2);
      dst->_type = (char)uVar1;
      dst->_prefix_len = (char)((ushort)uVar1 >> 8);
      uVar3 = puVar2[1];
      *(undefined8 *)dst->_addr = *puVar2;
      *(undefined8 *)(dst->_addr + 8) = uVar3;
      return 0;
    }
    lVar17 = lVar17 + 0x10;
  } while (lVar17 != 0x58);
  strscpy(local_6e,src,0x3e);
  src_00 = str_trim(local_6e);
  cVar8 = *src_00;
  uVar12 = (ulong)cVar8;
  bVar18 = uVar12 == 0;
  pcVar16 = src_00;
  if (bVar18) {
    local_90 = 0xffffffff;
    iVar6 = 0;
    iVar15 = 0;
    bVar5 = false;
    bVar4 = false;
    pcVar9 = extraout_RDX;
  }
  else {
    local_90 = 0xffffffff;
    ppuVar7 = __ctype_b_loc();
    bVar4 = false;
    pcVar9 = extraout_RDX_00;
    if (cVar8 == '/') {
      bVar5 = false;
      iVar15 = 0;
      iVar6 = 0;
    }
    else {
      bVar5 = false;
      iVar15 = 0;
      iVar6 = 0;
      if (((*ppuVar7)[uVar12] & 0x2000) == 0) {
        iVar6 = 0;
        iVar15 = 0;
        bVar5 = false;
        bVar4 = false;
        pcVar9 = (char *)0x0;
        do {
          pcVar16 = pcVar16 + 1;
          if ((char)uVar12 == '-') {
            iVar15 = iVar15 + 1;
          }
          else {
            uVar13 = (uint)uVar12 & 0xff;
            if (uVar13 == 0x2e) {
              bVar4 = true;
            }
            else if (uVar13 == 0x3a) {
              if (pcVar9 != (char *)0x0) {
                bVar5 = true;
              }
              iVar6 = iVar6 + 1;
            }
          }
          uVar14 = (ulong)*pcVar16;
          bVar18 = uVar14 == 0;
          if (bVar18) goto LAB_00109ea5;
          pcVar9 = (char *)(ulong)((char)uVar12 == ':');
        } while ((*pcVar16 != '/') &&
                (uVar12 = uVar14 & 0xffffffff, ((*ppuVar7)[uVar14] & 0x2000) == 0));
      }
    }
    if (!bVar18) {
      ppuVar7 = __ctype_b_loc();
      cVar8 = *pcVar16;
      puVar10 = *ppuVar7;
      while ((*(byte *)((long)puVar10 + (long)cVar8 * 2 + 1) & 0x20) != 0) {
        *pcVar16 = '\0';
        cVar8 = pcVar16[1];
        pcVar16 = pcVar16 + 1;
        puVar10 = *ppuVar7;
      }
      if (cVar8 == '/') {
        *pcVar16 = '\0';
        pcVar16 = pcVar16 + 1;
      }
      cVar8 = *pcVar16;
      puVar10 = *ppuVar7;
      while ((*(byte *)((long)puVar10 + (long)cVar8 * 2 + 1) & 0x20) != 0) {
        *pcVar16 = '\0';
        cVar8 = pcVar16[1];
        pcVar16 = pcVar16 + 1;
        puVar10 = *ppuVar7;
      }
      if (cVar8 == '\0') goto LAB_00109f73;
      uVar12 = strtoul(pcVar16,&local_78,10);
      local_90 = (uint)uVar12;
      pcVar9 = local_78;
      if (local_78 != (char *)0x0) {
        local_90 = -(uint)(*local_78 != '\0') | local_90;
      }
    }
  }
LAB_00109ea5:
  if ((((iVar15 != 5 && iVar6 != 5) || (iVar15 != 0 && iVar6 != 0)) || (bVar4)) || (bVar5)) {
    if ((iVar6 == 0 && !bVar4) && iVar15 == 7) {
      dst->_type = '0';
      dst->_prefix_len = '@';
      dst->_addr[7] = '\x02';
      bin_size = 8;
      goto LAB_00109f5d;
    }
    if ((bool)(iVar6 == 0 & bVar4 & iVar15 == 0)) {
      dst->_type = '\x02';
      dst->_prefix_len = ' ';
      iVar6 = inet_pton(2,src_00,dst);
      iVar11 = -(uint)(iVar6 != 1);
      if (((iVar6 == 1) && (*pcVar16 != '\0')) && (local_90 == 0xffffffff)) {
        local_90 = _subnetmask_to_prefixlen(pcVar16);
      }
    }
    else if ((bool)((iVar6 == 7 | bVar5) & iVar15 == 0)) {
      dst->_type = '\n';
      dst->_prefix_len = 0x80;
      iVar6 = inet_pton(10,src_00,dst);
      iVar11 = -(uint)(iVar6 != 1);
    }
    else {
      iVar11 = -1;
      if ((iVar6 == 0 && iVar15 == 4) && !bVar4) {
        dst->_type = '1';
        dst->_prefix_len = 0x80;
        iVar11 = _uuid_from_string(dst,(size_t)src_00,pcVar9);
      }
    }
  }
  else {
    dst->_type = '/';
    dst->_prefix_len = '0';
    bin_size = 6;
    if (iVar6 == 0) {
LAB_00109f5d:
      cVar8 = '-';
    }
    else {
      cVar8 = ':';
    }
    iVar11 = _bin_from_hex(dst,bin_size,src_00,cVar8);
  }
  if (iVar11 == 0) {
    if (*pcVar16 == '\0') {
      return 0;
    }
    if ((-1 < (int)local_90) && ((int)local_90 <= (int)(uint)dst->_prefix_len)) {
      dst->_prefix_len = (uint8_t)local_90;
      return 0;
    }
  }
LAB_00109f73:
  dst->_type = '\0';
  return -1;
}

Assistant:

int
netaddr_from_string(struct netaddr *dst, const char *src) {
  struct netaddr_str buf;
  unsigned int colon_count, minus_count;
  int result;
  int prefix_len;
  bool has_coloncolon, has_point;
  bool last_was_colon;
  char *ptr1, *ptr2, *ptr3;
  size_t i;

  memset(dst, 0, sizeof(*dst));

  if (strcmp(src, "-") == 0) {
    /* unspec */
    netaddr_invalidate(dst);
    return 0;
  }

  /* handle string representations of prefixes */
  for (i = 0; i < ARRAYSIZE(_known_prefixes); i++) {
    if (strcasecmp(src, _known_prefixes[i].name) == 0) {
      memcpy(dst, _known_prefixes[i].prefix, sizeof(*dst));
      return 0;
    }
  }

  colon_count = 0;
  minus_count = 0;
  has_coloncolon = false;
  has_point = false;

  last_was_colon = false;

  result = -1;
  prefix_len = -1;

  /* copy input string in temporary buffer */
  strscpy(buf.buf, src, sizeof(buf));
  ptr1 = buf.buf;

  ptr1 = str_trim(ptr1);

  ptr2 = ptr1;
  while (*ptr2 != 0 && !isspace(*ptr2) && *ptr2 != '/') {
    switch (*ptr2) {
      case ':':
        if (last_was_colon) {
          has_coloncolon = true;
        }
        colon_count++;
        break;

      case '.':
        has_point = true;
        break;

      case '-':
        minus_count++;
        break;

      default:
        break;
    }
    last_was_colon = *ptr2++ == ':';
  }

  if (*ptr2) {
    /* split strings */
    while (isspace(*ptr2))
      *ptr2++ = 0;
    if (*ptr2 == '/') {
      *ptr2++ = 0;
    }
    while (isspace(*ptr2))
      *ptr2++ = 0;

    if (*ptr2 == 0) {
      /* prefixlength is missing */
      dst->_type = AF_UNSPEC;
      return -1;
    }

    /* try to read numeric prefix length */
    prefix_len = (int)strtoul(ptr2, &ptr3, 10);
    if (ptr3 && *ptr3) {
      /* not a numeric prefix length */
      prefix_len = -1;
    }
  }

  /* use dst->prefix_len as storage for maximum prefixlen */
  if ((colon_count == 5 || minus_count == 5) && (colon_count == 0 || minus_count == 0) && !has_point &&
      !has_coloncolon) {
    dst->_type = AF_MAC48;
    dst->_prefix_len = 48;
    if (colon_count > 0) {
      result = _bin_from_hex(dst->_addr, 6, ptr1, ':');
    }
    else {
      result = _bin_from_hex(dst->_addr, 6, ptr1, '-');
    }
  }
  else if (colon_count == 0 && !has_point && minus_count == 7) {
    dst->_type = AF_EUI64;
    dst->_prefix_len = 64;
    dst->_addr[7] = 2;
    result = _bin_from_hex(dst->_addr, 8, ptr1, '-');
  }
  else if (colon_count == 0 && has_point && minus_count == 0) {
    dst->_type = AF_INET;
    dst->_prefix_len = 32;
    result = inet_pton(AF_INET, ptr1, dst->_addr) == 1 ? 0 : -1;

    if (result == 0 && *ptr2 && prefix_len == -1) {
      /* we need a prefix length, but its not a numerical one */
      prefix_len = _subnetmask_to_prefixlen(ptr2);
    }
  }
  else if ((has_coloncolon || colon_count == 7) && minus_count == 0) {
    dst->_type = AF_INET6;
    dst->_prefix_len = 128;
    result = inet_pton(AF_INET6, ptr1, dst->_addr) == 1 ? 0 : -1;
  }
  else if (minus_count == 4 && colon_count == 0 && !has_point) {
    dst->_type = AF_UUID;
    dst->_prefix_len = 128;
    result = _uuid_from_string(dst->_addr, sizeof(dst->_addr), ptr1);
  }

  /* stop if an error happened */
  if (result) {
    dst->_type = AF_UNSPEC;
    return -1;
  }

  if (*ptr2) {
    if (prefix_len < 0 || prefix_len > dst->_prefix_len) {
      /* prefix is too long */
      dst->_type = AF_UNSPEC;
      return -1;
    }

    /* store real prefix length */
    dst->_prefix_len = (uint8_t)prefix_len;
  }
  return 0;
}